

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * FIX::file_appendpath(string *__return_storage_ptr__,string *path,string *file)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = &bStack_78;
  cVar1 = (path->_M_dataplus)._M_p[path->_M_string_length - 1];
  if ((cVar1 == '\\') || (cVar1 == '/')) {
    std::__cxx11::string::string((string *)&bStack_78,(string *)path);
    std::operator+(__return_storage_ptr__,&bStack_78,file);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)path);
    file_separator_abi_cxx11_();
    std::operator+(&bStack_78,&local_38,&local_58);
    std::operator+(__return_storage_ptr__,&bStack_78,file);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    this = &local_38;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string file_appendpath(const std::string &path, const std::string &file) {
  const char last = path[path.size() - 1];
  if (last == '/' || last == '\\') {
    return std::string(path) + file;
  } else {
    return std::string(path) + file_separator() + file;
  }
}